

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_parserInternals(void)

{
  uint uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  xmlParserCtxtPtr pxVar15;
  xmlNodePtr pxVar16;
  xmlChar *pxVar17;
  char *pcVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  xmlNodePtr __s;
  undefined1 uVar22;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 uVar23;
  ulong uVar24;
  int n_ctxt_3;
  uint uVar25;
  xmlChar *pxVar26;
  xmlNodePtr pxVar27;
  int test_ret_6;
  uint uVar28;
  uint *puVar29;
  uint uVar30;
  xmlNodePtr in_RSI;
  bool bVar31;
  ulong uVar32;
  int test_ret_7;
  int n_ctxt;
  uint uVar33;
  int local_88;
  int local_84;
  int local_80;
  int test_ret_3;
  int test_ret_1;
  int local_74;
  int test_ret;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int test_ret_4;
  int test_ret_2;
  int test_ret_5;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing parserInternals : 30 of 87 functions ...");
  }
  local_68 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    iVar4 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar33,(int)in_RSI);
    inputPop(pxVar15);
    xmlFreeInputStream();
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in inputPop",(ulong)(uint)(iVar5 - iVar4));
      local_68 = local_68 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
    bVar31 = true;
    while (iVar7 = (int)in_RSI, bVar31) {
      iVar6 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(iVar5,iVar7);
      in_RSI = (xmlNodePtr)0x0;
      inputPush();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 == iVar7) break;
      iVar7 = xmlMemBlocks();
      bVar31 = false;
      printf("Leak of %d blocks found in inputPush",(ulong)(uint)(iVar7 - iVar6));
      iVar4 = iVar4 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    iVar5 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar33,(int)in_RSI);
    namePop();
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar5 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in namePop",(ulong)(uint)(iVar7 - iVar5));
      local_6c = local_6c + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_80 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar7 = (int)pxVar16;
      if (iVar7 == 5) break;
      iVar6 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(uVar33,iVar5);
      in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar7,iVar5);
      namePush();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar6 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in namePush",(ulong)(uint)(iVar5 - iVar6));
        local_80 = local_80 + 1;
        printf(" %d",(ulong)uVar33);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar16;
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    iVar5 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar33,(int)in_RSI);
    pxVar16 = (xmlNodePtr)nodePop(pxVar15);
    desret_xmlNodePtr(pxVar16);
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar5 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in nodePop",(ulong)(uint)(iVar7 - iVar5));
      test_ret = test_ret + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while( true ) {
      iVar7 = (int)in_RSI;
      iVar6 = (int)pxVar16;
      if (iVar6 == 3) break;
      iVar8 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(uVar33,iVar7);
      in_RSI = gen_xmlNodePtr(iVar6,iVar7);
      nodePush(pxVar15,in_RSI);
      call_tests = call_tests + 1;
      iVar7 = extraout_EDX;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar15);
        iVar7 = extraout_EDX_00;
      }
      des_xmlNodePtr(iVar6,in_RSI,iVar7);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar8 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in nodePush",(ulong)(uint)(iVar7 - iVar8));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar33);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar16;
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar33 = 0; uVar33 != 5; uVar33 = uVar33 + 1) {
    iVar7 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar33,(int)in_RSI);
    xmlCheckLanguageID();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar7 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckLanguageID",(ulong)(uint)(iVar6 - iVar7));
      test_ret_1 = test_ret_1 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_84 = 0;
  for (uVar33 = 0; uVar33 != 4; uVar33 = uVar33 + 1) {
    for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
      pxVar16 = (xmlNodePtr)0x0;
      pxVar26 = (xmlChar *)0x0;
      if (uVar10 == 0) {
        pxVar26 = chartab;
      }
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar6 = (int)pxVar16;
        if (iVar6 == 4) break;
        iVar8 = xmlMemBlocks();
        iVar9 = gen_int(uVar33,iVar7);
        iVar7 = gen_int(iVar6,iVar7);
        in_RSI = (xmlNodePtr)pxVar26;
        xmlCopyChar(iVar9,pxVar26,iVar7);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar8 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCopyChar",(ulong)(uint)(iVar7 - iVar8));
          local_84 = local_84 + 1;
          printf(" %d",(ulong)uVar33);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar16;
        }
        pxVar16 = (xmlNodePtr)(ulong)(iVar6 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar33 = 0; uVar33 != 2; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar8 = (int)pxVar16;
      if (iVar8 == 4) break;
      iVar9 = xmlMemBlocks();
      uVar10 = gen_int(iVar8,iVar6);
      in_RSI = (xmlNodePtr)(ulong)uVar10;
      xmlCopyCharMultiByte();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar9 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyCharMultiByte",(ulong)(uint)(iVar6 - iVar9));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar33);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar16;
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar8 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_88 = 0;
  for (uVar33 = 0; uVar33 != 5; uVar33 = uVar33 + 1) {
    uVar21 = 0;
    while (iVar6 = (int)uVar21, iVar6 != 5) {
      pxVar16 = (xmlNodePtr)0x0;
      while( true ) {
        iVar8 = (int)in_RSI;
        iVar9 = (int)pxVar16;
        if (iVar9 == 5) break;
        iVar11 = xmlMemBlocks();
        pxVar26 = gen_const_xmlChar_ptr(uVar33,iVar8);
        in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar6,iVar8);
        pxVar17 = gen_const_xmlChar_ptr(iVar9,iVar8);
        xmlCreateEntityParserCtxt(pxVar26,in_RSI,pxVar17);
        xmlFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar11 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateEntityParserCtxt",
                 (ulong)(uint)(iVar8 - iVar11));
          local_88 = local_88 + 1;
          printf(" %d",(ulong)uVar33);
          printf(" %d",uVar21);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar16;
        }
        pxVar16 = (xmlNodePtr)(ulong)(iVar9 + 1);
      }
      uVar21 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  for (uVar33 = 0; uVar33 != 6; uVar33 = uVar33 + 1) {
    iVar6 = xmlMemBlocks();
    pcVar18 = gen_fileoutput(uVar33,(int)in_RSI);
    xmlCreateFileParserCtxt(pcVar18);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar6 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateFileParserCtxt",(ulong)(uint)(iVar8 - iVar6));
      test_ret_3 = test_ret_3 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar33 = 0; uVar33 != 4; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while (iVar6 = (int)pxVar16, iVar6 != 4) {
      iVar8 = xmlMemBlocks();
      if (uVar33 == 0) {
        bVar31 = false;
        pcVar18 = "foo";
      }
      else if (uVar33 == 2) {
        bVar31 = false;
        pcVar18 = "test/ent2";
      }
      else if (uVar33 == 1) {
        bVar31 = false;
        pcVar18 = "<foo/>";
      }
      else {
        bVar31 = true;
        pcVar18 = (char *)0x0;
      }
      uVar10 = gen_int(iVar6,(int)in_RSI);
      if ((bVar31) || (sVar19 = strlen(pcVar18), (int)uVar10 <= (int)sVar19 + 1)) {
        in_RSI = (xmlNodePtr)(ulong)uVar10;
        xmlCreateMemoryParserCtxt(pcVar18);
        xmlFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateMemoryParserCtxt",(ulong)(uint)(iVar9 - iVar8)
                );
          local_64 = local_64 + 1;
          printf(" %d",(ulong)uVar33);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar16;
        }
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  for (uVar33 = 0; uVar33 != 6; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar8 = (int)pxVar16;
      if (iVar8 == 4) break;
      iVar9 = xmlMemBlocks();
      pcVar18 = gen_fileoutput(uVar33,iVar6);
      uVar10 = gen_int(iVar8,iVar6);
      in_RSI = (xmlNodePtr)(ulong)uVar10;
      xmlCreateURLParserCtxt(pcVar18);
      xmlFreeParserCtxt();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar9 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateURLParserCtxt",(ulong)(uint)(iVar6 - iVar9));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar33);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar16;
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar8 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_60 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar8 = (int)pxVar16;
      if (iVar8 == 2) break;
      iVar9 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(uVar33,iVar6);
      in_RSI = (xmlNodePtr)0x0;
      if (iVar8 == 0) {
        in_RSI = (xmlNodePtr)(inttab + 1);
      }
      xmlCurrentChar();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar9 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCurrentChar",(ulong)(uint)(iVar6 - iVar9));
        local_60 = local_60 + 1;
        printf(" %d",(ulong)uVar33);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar16;
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar8 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  for (uVar33 = 0; uVar33 != 4; uVar33 = uVar33 + 1) {
    iVar6 = xmlMemBlocks();
    gen_int(uVar33,(int)in_RSI);
    xmlIsLetter();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar6 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsLetter",(ulong)(uint)(iVar8 - iVar6));
      local_34 = local_34 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  for (iVar8 = 0; iVar8 != 3; iVar8 = iVar8 + 1) {
    bVar31 = true;
    while (iVar9 = (int)in_RSI, bVar31) {
      iVar11 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(iVar8,iVar9);
      in_RSI = (xmlNodePtr)0x0;
      xmlNewEntityInputStream(pxVar15);
      xmlFreeInputStream();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar11 == iVar9) break;
      iVar9 = xmlMemBlocks();
      bVar31 = false;
      printf("Leak of %d blocks found in xmlNewEntityInputStream",(ulong)(uint)(iVar9 - iVar11));
      iVar6 = iVar6 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_74 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while( true ) {
      iVar8 = (int)in_RSI;
      iVar9 = (int)pxVar16;
      if (iVar9 == 8) break;
      iVar11 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(uVar33,iVar8);
      in_RSI = (xmlNodePtr)gen_filepath(iVar9,iVar8);
      xmlNewInputFromFile(pxVar15);
      xmlFreeInputStream();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar11 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewInputFromFile",(ulong)(uint)(iVar8 - iVar11));
        local_74 = local_74 + 1;
        printf(" %d",(ulong)uVar33);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar16;
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar9 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    iVar8 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar33,(int)in_RSI);
    xmlNewInputStream(pxVar15);
    xmlFreeInputStream();
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewInputStream",(ulong)(uint)(iVar9 - iVar8));
      test_ret_5 = test_ret_5 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar8 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    pxVar16 = (xmlNodePtr)0x0;
    while( true ) {
      iVar9 = (int)in_RSI;
      iVar11 = (int)pxVar16;
      if (iVar11 == 5) break;
      iVar12 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(uVar33,iVar9);
      in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar11,iVar9);
      xmlNewStringInputStream(pxVar15);
      xmlFreeInputStream();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar12 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewStringInputStream",(ulong)(uint)(iVar9 - iVar12));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar33);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar16;
      }
      pxVar16 = (xmlNodePtr)(ulong)(iVar11 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  pxVar16 = (xmlNodePtr)0x0;
  while (iVar11 = (int)pxVar16, iVar11 != 3) {
    iVar12 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(iVar11,(int)in_RSI);
    xmlNextChar();
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextChar",(ulong)(uint)(iVar13 - iVar12));
      iVar9 = iVar9 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar16;
    }
    pxVar16 = (xmlNodePtr)(ulong)(iVar11 + 1);
  }
  function_tests = function_tests + 1;
  local_74 = -(local_74 + test_ret_5 + iVar8 + iVar9 +
              local_64 + test_ret_4 + local_60 + local_34 + iVar6 +
              local_84 + iVar7 + local_88 + test_ret_3 +
              test_ret + iVar5 + test_ret_1 + local_6c + local_80 + local_68 + iVar4);
  bVar31 = true;
  while (bVar31) {
    iVar4 = xmlMemBlocks();
    xmlParserInputShrink(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 == iVar5) break;
    xmlMemBlocks();
    bVar31 = false;
    printf("Leak of %d blocks found in xmlParserInputShrink");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_74 = local_74 + -1;
  }
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
    iVar4 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar33,(int)in_RSI);
    xmlPopInput(pxVar15);
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar15);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPopInput",(ulong)(uint)(iVar5 - iVar4));
      test_ret_3 = test_ret_3 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar33;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  test_ret_1 = 0;
  do {
    if (iVar4 == 3) {
      function_tests = function_tests + 1;
      test_ret = 0;
      uVar21 = 0;
      while (iVar4 = (int)uVar21, iVar4 != 3) {
        for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
          bVar31 = true;
          while (iVar7 = (int)in_RSI, bVar31) {
            iVar6 = xmlMemBlocks();
            pxVar15 = gen_xmlParserCtxtPtr(iVar4,iVar7);
            in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar5,iVar7);
            lVar20 = xmlSplitQName(pxVar15,in_RSI,0);
            if (lVar20 != 0) {
              (*_xmlFree)(lVar20);
            }
            call_tests = call_tests + 1;
            if (pxVar15 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar15);
            }
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 == iVar7) break;
            iVar7 = xmlMemBlocks();
            bVar31 = false;
            printf("Leak of %d blocks found in xmlSplitQName",(ulong)(uint)(iVar7 - iVar6));
            test_ret = test_ret + 1;
            printf(" %d",uVar21);
            printf(" %d");
            in_RSI = (xmlNodePtr)0x0;
            printf(" %d");
            putchar(10);
          }
        }
        uVar21 = (ulong)(iVar4 + 1);
      }
      function_tests = function_tests + 1;
      local_6c = 0;
      for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
        uVar21 = 0;
        while (iVar4 = (int)uVar21, iVar4 != 5) {
          pxVar16 = (xmlNodePtr)0x0;
          while( true ) {
            iVar5 = (int)in_RSI;
            iVar7 = (int)pxVar16;
            if (iVar7 == 2) break;
            iVar6 = xmlMemBlocks();
            pxVar15 = gen_xmlParserCtxtPtr(uVar33,iVar5);
            in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar4,iVar5);
            uVar23 = 0;
            if (iVar7 == 0) {
              uVar23 = 0x1668d8;
            }
            xmlStringCurrentChar(pxVar15,in_RSI,uVar23);
            call_tests = call_tests + 1;
            if (pxVar15 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar15);
            }
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar6 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlStringCurrentChar",(ulong)(uint)(iVar5 - iVar6))
              ;
              local_6c = local_6c + 1;
              printf(" %d",(ulong)uVar33);
              printf(" %d",uVar21);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar16;
            }
            pxVar16 = (xmlNodePtr)(ulong)(iVar7 + 1);
          }
          uVar21 = (ulong)(iVar4 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_68 = 0;
      uVar21 = 0;
      while (iVar4 = (int)uVar21, iVar4 != 3) {
        uVar32 = 0;
        while (iVar5 = (int)uVar32, iVar5 != 5) {
          for (uVar33 = 0; uVar33 != 4; uVar33 = uVar33 + 1) {
            uVar24 = 0;
            while (uVar10 = (uint)uVar24, uVar10 != 4) {
              uVar2 = (undefined1)(0xf82061 >> ((char)uVar24 * '\b' & 0x1fU));
              in_RSI = (xmlNodePtr)0x0;
              if (2 < uVar10) {
                uVar2 = 0;
              }
              while (uVar25 = (uint)in_RSI, uVar25 != 4) {
                uVar3 = (undefined1)(0xf82061 >> ((char)in_RSI * '\b' & 0x1fU));
                pxVar27 = (xmlNodePtr)0x0;
                pxVar16 = in_RSI;
                if (2 < uVar25) {
                  uVar3 = 0;
                }
                while( true ) {
                  iVar7 = (int)pxVar16;
                  uVar14 = (uint)pxVar27;
                  if (uVar14 == 4) break;
                  iVar6 = xmlMemBlocks();
                  pxVar15 = gen_xmlParserCtxtPtr(iVar4,iVar7);
                  pxVar16 = (xmlNodePtr)gen_const_xmlChar_ptr(iVar5,iVar7);
                  iVar7 = gen_int(uVar33,iVar7);
                  uVar22 = (undefined1)(0xf82061 >> ((char)pxVar27 * '\b' & 0x1fU));
                  if (2 < uVar14) {
                    uVar22 = 0;
                  }
                  lVar20 = xmlStringDecodeEntities(pxVar15,pxVar16,iVar7,uVar2,uVar3,uVar22);
                  if (lVar20 != 0) {
                    (*_xmlFree)(lVar20);
                  }
                  call_tests = call_tests + 1;
                  if (pxVar15 != (xmlParserCtxtPtr)0x0) {
                    xmlFreeParserCtxt(pxVar15);
                  }
                  xmlResetLastError();
                  iVar7 = xmlMemBlocks();
                  if (iVar6 != iVar7) {
                    iVar7 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlStringDecodeEntities",
                           (ulong)(uint)(iVar7 - iVar6));
                    local_68 = local_68 + 1;
                    printf(" %d",uVar21);
                    printf(" %d",uVar32);
                    printf(" %d",(ulong)uVar33);
                    printf(" %d",uVar24);
                    printf(" %d",in_RSI);
                    printf(" %d");
                    putchar(10);
                    pxVar16 = pxVar27;
                  }
                  pxVar27 = (xmlNodePtr)(ulong)(uVar14 + 1);
                }
                in_RSI = (xmlNodePtr)(ulong)(uVar25 + 1);
              }
              uVar24 = (ulong)(uVar10 + 1);
            }
          }
          uVar32 = (ulong)(iVar5 + 1);
        }
        uVar21 = (ulong)(iVar4 + 1);
      }
      function_tests = function_tests + 1;
      local_64 = 0;
      for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
        for (uVar33 = 0; uVar33 != 5; uVar33 = uVar33 + 1) {
          for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
            for (uVar25 = 0; uVar25 != 4; uVar25 = uVar25 + 1) {
              uVar21 = 0;
              while (uVar14 = (uint)uVar21, uVar14 != 4) {
                uVar2 = (undefined1)(0xf82061 >> ((char)uVar21 * '\b' & 0x1fU));
                in_RSI = (xmlNodePtr)0x0;
                if (2 < uVar14) {
                  uVar2 = 0;
                }
                while (uVar30 = (uint)in_RSI, uVar30 != 4) {
                  uVar3 = (undefined1)(0xf82061 >> ((char)in_RSI * '\b' & 0x1fU));
                  pxVar27 = (xmlNodePtr)0x0;
                  pxVar16 = in_RSI;
                  if (2 < uVar30) {
                    uVar3 = 0;
                  }
                  while (uVar28 = (uint)pxVar27, uVar28 != 4) {
                    iVar5 = xmlMemBlocks();
                    pxVar15 = gen_xmlParserCtxtPtr(iVar4,(int)pxVar16);
                    __s = (xmlNodePtr)gen_const_xmlChar_ptr(uVar33,(int)pxVar16);
                    iVar7 = gen_int(uVar10,(int)pxVar16);
                    iVar6 = gen_int(uVar25,(int)pxVar16);
                    uVar1 = 0xf82061 >> ((char)pxVar27 * '\b' & 0x1fU);
                    if (2 < uVar28) {
                      uVar1 = 0;
                    }
                    if ((__s == (xmlNodePtr)0x0) ||
                       (sVar19 = strlen((char *)__s), iVar7 <= (int)sVar19 + 1)) {
                      lVar20 = xmlStringLenDecodeEntities
                                         (pxVar15,__s,iVar7,iVar6,uVar2,uVar3,uVar1 & 0xff);
                      pxVar16 = __s;
                      if (lVar20 != 0) {
                        (*_xmlFree)(lVar20);
                        pxVar16 = __s;
                      }
                      call_tests = call_tests + 1;
                      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
                        xmlFreeParserCtxt(pxVar15);
                      }
                      xmlResetLastError();
                      iVar7 = xmlMemBlocks();
                      if (iVar5 != iVar7) {
                        iVar7 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
                               (ulong)(uint)(iVar7 - iVar5));
                        local_64 = local_64 + 1;
                        printf(" %d",iVar4);
                        printf(" %d",(ulong)uVar33);
                        printf(" %d",(ulong)uVar10);
                        printf(" %d",(ulong)uVar25);
                        printf(" %d",uVar21);
                        printf(" %d",in_RSI);
                        printf(" %d");
                        putchar(10);
                        pxVar16 = pxVar27;
                      }
                    }
                    pxVar27 = (xmlNodePtr)(ulong)(uVar28 + 1);
                  }
                  in_RSI = (xmlNodePtr)(ulong)(uVar30 + 1);
                }
                uVar21 = (ulong)(uVar14 + 1);
              }
            }
          }
        }
      }
      function_tests = function_tests + 1;
      local_88 = 0;
      for (uVar33 = 0; uVar33 != 3; uVar33 = uVar33 + 1) {
        pxVar16 = (xmlNodePtr)0x0;
        puVar29 = &DAT_001510b0;
        while( true ) {
          iVar4 = (int)in_RSI;
          uVar10 = (uint)pxVar16;
          if (uVar10 == 4) break;
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlParserCtxtPtr(uVar33,iVar4);
          in_RSI = (xmlNodePtr)0xffffffffffffffff;
          if (uVar10 < 3) {
            in_RSI = (xmlNodePtr)(ulong)*puVar29;
          }
          xmlSwitchEncoding(pxVar15);
          call_tests = call_tests + 1;
          if (pxVar15 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt(pxVar15);
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar5 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSwitchEncoding",(ulong)(uint)(iVar4 - iVar5));
            local_88 = local_88 + 1;
            printf(" %d",(ulong)uVar33);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar16;
          }
          pxVar16 = (xmlNodePtr)(ulong)(uVar10 + 1);
          puVar29 = puVar29 + 1;
        }
      }
      function_tests = function_tests + 1;
      iVar5 = 0;
      for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
        bVar31 = true;
        while (bVar31) {
          bVar31 = true;
          while (iVar7 = (int)in_RSI, bVar31) {
            iVar6 = xmlMemBlocks();
            pxVar15 = gen_xmlParserCtxtPtr(iVar4,iVar7);
            in_RSI = (xmlNodePtr)0x0;
            xmlSwitchInputEncoding(pxVar15,0,0);
            call_tests = call_tests + 1;
            if (pxVar15 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar15);
            }
            xmlResetLastError();
            iVar7 = xmlMemBlocks();
            if (iVar6 == iVar7) break;
            iVar7 = xmlMemBlocks();
            bVar31 = false;
            printf("Leak of %d blocks found in xmlSwitchInputEncoding",(ulong)(uint)(iVar7 - iVar6))
            ;
            iVar5 = iVar5 + 1;
            printf(" %d");
            printf(" %d");
            in_RSI = (xmlNodePtr)0x0;
            printf(" %d");
            putchar(10);
          }
          bVar31 = false;
        }
      }
      function_tests = function_tests + 1;
      iVar4 = 0;
      iVar7 = 0;
      do {
        if (iVar4 == 3) {
          function_tests = function_tests + 1;
          iVar4 = iVar5 + iVar7 +
                  local_68 + local_64 + local_88 + test_ret + local_6c + test_ret_3 + test_ret_1;
          uVar33 = -(local_74 - iVar4);
          if (local_74 != iVar4) {
            printf("Module parserInternals: %d errors\n",(ulong)uVar33);
          }
          return uVar33;
        }
        bVar31 = true;
        while (iVar6 = (int)in_RSI, bVar31) {
          iVar8 = xmlMemBlocks();
          pxVar15 = gen_xmlParserCtxtPtr(iVar4,iVar6);
          in_RSI = (xmlNodePtr)0x0;
          xmlSwitchToEncoding(pxVar15);
          call_tests = call_tests + 1;
          if (pxVar15 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt(pxVar15);
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar8 == iVar6) break;
          iVar6 = xmlMemBlocks();
          bVar31 = false;
          printf("Leak of %d blocks found in xmlSwitchToEncoding",(ulong)(uint)(iVar6 - iVar8));
          iVar7 = iVar7 + 1;
          printf(" %d");
          in_RSI = (xmlNodePtr)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar4 = iVar4 + 1;
      } while( true );
    }
    bVar31 = true;
    while (iVar5 = (int)in_RSI, bVar31) {
      iVar7 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(iVar4,iVar5);
      in_RSI = (xmlNodePtr)0x0;
      xmlPushInput(pxVar15);
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar15);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 == iVar5) break;
      iVar5 = xmlMemBlocks();
      bVar31 = false;
      printf("Leak of %d blocks found in xmlPushInput",(ulong)(uint)(iVar5 - iVar7));
      test_ret_1 = test_ret_1 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 30 of 87 functions ...\n");
    test_ret += test_inputPop();
    test_ret += test_inputPush();
    test_ret += test_namePop();
    test_ret += test_namePush();
    test_ret += test_nodePop();
    test_ret += test_nodePush();
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSetEntityReferenceFunc();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}